

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O0

int ndiGetBXPortStatus(ndicapi *pol,int portHandle)

{
  uint local_20;
  int n;
  int i;
  int portHandle_local;
  ndicapi *pol_local;
  
  local_20 = 0;
  while (((int)local_20 < (int)(uint)pol->BxHandleCount &&
         (pol->BxHandles[(int)local_20] != portHandle))) {
    local_20 = local_20 + 1;
  }
  if (local_20 == pol->BxHandleCount) {
    pol_local._4_4_ = 0;
  }
  else {
    pol_local._4_4_ = pol->BxPortStatus[(int)local_20];
  }
  return pol_local._4_4_;
}

Assistant:

ndicapiExport int ndiGetBXPortStatus(ndicapi* pol, int portHandle)
{
  int i, n;

  n = pol->BxHandleCount;
  for (i = 0; i < n; i++)
  {
    if (pol->BxHandles[i] == portHandle)
    {
      break;
    }
  }
  if (i == n)
  {
    return 0;
  }

  return pol->BxPortStatus[i];
}